

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U32 ZSTD_resolveRepcodeToRawOffset(U32 *rep,U32 offCode,U32 ll0)

{
  U32 adjustedOffCode;
  U32 ll0_local;
  U32 offCode_local;
  U32 *rep_local;
  
  if (offCode + ll0 == 3) {
    rep_local._4_4_ = *rep - 1;
  }
  else {
    rep_local._4_4_ = rep[offCode + ll0];
  }
  return rep_local._4_4_;
}

Assistant:

static U32 ZSTD_resolveRepcodeToRawOffset(const U32 rep[ZSTD_REP_NUM], const U32 offCode, const U32 ll0) {
    U32 const adjustedOffCode = offCode + ll0;
    assert(offCode < ZSTD_REP_NUM);
    if (adjustedOffCode == ZSTD_REP_NUM) {
        /* litlength == 0 and offCode == 2 implies selection of first repcode - 1 */
        assert(rep[0] > 0);
        return rep[0] - 1;
    }
    return rep[adjustedOffCode];
}